

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_AggregateValueNotFound_Test::TestBody
          (ValidationErrorTest_AggregateValueNotFound_Test *this)

{
  char *value;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48
  ;
  string local_30;
  ValidationErrorTest_AggregateValueNotFound_Test *local_10;
  ValidationErrorTest_AggregateValueNotFound_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  EmbedAggregateValue_abi_cxx11_(&local_30,(descriptor_unittest *)"string_value: \"\"",value);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_48,
            "foo.proto: foo.proto: OPTION_VALUE: Option \"foo\" is a message. To set the entire message, use syntax like \"foo = { <proto text format> }\". To set fields within it, use syntax like \"foo.foo = value\".\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_48);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, AggregateValueNotFound) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      EmbedAggregateValue("string_value: \"\""),
      "foo.proto: foo.proto: OPTION_VALUE: Option \"foo\" is a message. "
      "To set the entire message, use syntax like "
      "\"foo = { <proto text format> }\". To set fields within it, use "
      "syntax like \"foo.foo = value\".\n");
}